

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O2

bool IsChildWithParents(Package *package)

{
  pointer psVar1;
  element_type *peVar2;
  pointer pCVar3;
  bool bVar4;
  ulong uVar5;
  pointer psVar6;
  ulong uVar7;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __it;
  long lVar8;
  shared_ptr<const_CTransaction> *psVar9;
  pointer pCVar10;
  long lVar11;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  _Var12;
  long in_FS_OFFSET;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  input_txids;
  insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
  local_68;
  value_type local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar6 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)psVar1 - (long)psVar6;
  uVar7 = uVar5;
  for (lVar8 = (long)uVar5 >> 6; 0 < lVar8; lVar8 = lVar8 + -1) {
    if ((psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (element_type *)0x0) goto LAB_00256b19;
    if (psVar6[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      psVar6 = psVar6 + 1;
      goto LAB_00256b19;
    }
    if (psVar6[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      psVar6 = psVar6 + 2;
      goto LAB_00256b19;
    }
    if (psVar6[3].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      psVar6 = psVar6 + 3;
      goto LAB_00256b19;
    }
    psVar6 = psVar6 + 4;
    uVar7 = uVar7 - 0x40;
  }
  lVar8 = (long)uVar7 >> 4;
  if (lVar8 == 1) {
LAB_00256aff:
    if ((psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      psVar6 = psVar1;
    }
LAB_00256b19:
    if (psVar6 != psVar1) {
      __assert_fail("std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;})"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/packages.cpp"
                    ,0x79,"bool IsChildWithParents(const Package &)");
    }
  }
  else {
    if (lVar8 == 2) {
LAB_00256af5:
      if ((psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) {
        psVar6 = psVar6 + 1;
        goto LAB_00256aff;
      }
      goto LAB_00256b19;
    }
    if (lVar8 == 3) {
      if ((psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) {
        psVar6 = psVar6 + 1;
        goto LAB_00256af5;
      }
      goto LAB_00256b19;
    }
  }
  if (uVar5 < 0x11) {
    bVar4 = false;
    goto LAB_00256c6e;
  }
  std::
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&input_txids._M_h);
  peVar2 = psVar1[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar10 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar3 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_68.iter.super__Node_iterator_base<uint256,_true>._M_cur =
       (_Node_iterator_base<uint256,_true>)(__node_type *)0x0;
  local_68.container =
       (unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_> *
       )&input_txids._M_h;
  for (; pCVar10 != pCVar3; pCVar10 = pCVar10 + 1) {
    local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)&(pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data;
    local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((long)&(pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 8);
    local_58.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)
          ((long)&(pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x10);
    local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)
          ((long)&(pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x18);
    std::
    insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
    ::operator=(&local_68,&local_58);
  }
  __it._M_current =
       (package->
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  psVar9 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish + -1;
  lVar11 = (long)psVar9 - (long)__it._M_current;
  local_58.super_base_blob<256U>.m_data._M_elems._0_8_ = &input_txids._M_h;
  for (lVar8 = lVar11 >> 6; 0 < lVar8; lVar8 = lVar8 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_2>
            ::operator()((_Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__2>
                          *)&local_58,__it);
    _Var12._M_current = __it._M_current;
    if (bVar4) goto LAB_00256c5e;
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_2>
            ::operator()((_Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__2>
                          *)&local_58,__it._M_current + 1);
    _Var12._M_current = __it._M_current + 1;
    if (bVar4) goto LAB_00256c5e;
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_2>
            ::operator()((_Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__2>
                          *)&local_58,__it._M_current + 2);
    _Var12._M_current = __it._M_current + 2;
    if (bVar4) goto LAB_00256c5e;
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_2>
            ::operator()((_Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__2>
                          *)&local_58,__it._M_current + 3);
    _Var12._M_current = __it._M_current + 3;
    if (bVar4) goto LAB_00256c5e;
    __it._M_current = __it._M_current + 4;
    lVar11 = lVar11 + -0x40;
  }
  lVar11 = lVar11 >> 4;
  if (lVar11 == 1) {
LAB_00256c48:
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_2>
            ::operator()((_Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__2>
                          *)&local_58,__it);
    _Var12._M_current = __it._M_current;
    if (!bVar4) {
      _Var12._M_current = psVar9;
    }
  }
  else if (lVar11 == 2) {
LAB_00256c33:
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_2>
            ::operator()((_Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__2>
                          *)&local_58,__it);
    _Var12._M_current = __it._M_current;
    if (!bVar4) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00256c48;
    }
  }
  else {
    _Var12._M_current = psVar9;
    if ((lVar11 == 3) &&
       (bVar4 = __gnu_cxx::__ops::
                _Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_2>
                ::operator()((_Iter_negate<IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__2>
                              *)&local_58,__it), _Var12._M_current = __it._M_current, !bVar4)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00256c33;
    }
  }
LAB_00256c5e:
  bVar4 = _Var12._M_current == psVar9;
  std::
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&input_txids._M_h);
LAB_00256c6e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool IsChildWithParents(const Package& package)
{
    assert(std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;}));
    if (package.size() < 2) return false;

    // The package is expected to be sorted, so the last transaction is the child.
    const auto& child = package.back();
    std::unordered_set<uint256, SaltedTxidHasher> input_txids;
    std::transform(child->vin.cbegin(), child->vin.cend(),
                   std::inserter(input_txids, input_txids.end()),
                   [](const auto& input) { return input.prevout.hash; });

    // Every transaction must be a parent of the last transaction in the package.
    return std::all_of(package.cbegin(), package.cend() - 1,
                       [&input_txids](const auto& ptx) { return input_txids.count(ptx->GetHash()) > 0; });
}